

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

char GetBestLacingType(matroska_block *Element,int ForProfile)

{
  byte bVar1;
  ebml_context *peVar2;
  ebml_master *peVar3;
  ebml_integer *Element_00;
  int64_t iVar4;
  filepos_t fVar5;
  bool_t CanCompress;
  MatroskaContentEncodingScope CompressionScope;
  MatroskaTrackEncodingCompAlgo CompressionAlgo;
  ebml_element *Header;
  ebml_element *Elt2;
  ebml_element *Elt;
  ulong uStack_30;
  int32_t DataSize;
  size_t i;
  int local_20;
  int EbmlLacingSize;
  int XiphLacingSize;
  int ForProfile_local;
  matroska_block *Element_local;
  
  _CompressionScope = (ebml_integer *)0x0;
  CanCompress._4_4_ = MATROSKA_TRACK_ENCODING_COMP_NONE;
  CanCompress._0_4_ = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;
  if (Element == (matroska_block *)0xffffffffffffff78) {
    __assert_fail("&(Element->SizeList)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x655,"char GetBestLacingType(const matroska_block *, int)");
  }
  if ((Element->SizeList)._Used >> 2 < 2) {
    Element_local._7_1_ = '\0';
  }
  else {
    if (Element == (matroska_block *)0xffffffffffffff78) {
      __assert_fail("&(Element->SizeList)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x658,"char GetBestLacingType(const matroska_block *, int)");
    }
    Elt._4_4_ = *(int *)(Element->SizeList)._Begin;
    uStack_30 = 1;
    while( true ) {
      if (Element == (matroska_block *)0xffffffffffffff78) {
        __assert_fail("&(Element->SizeList)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x659,"char GetBestLacingType(const matroska_block *, int)");
      }
      if ((Element->SizeList)._Used >> 2 <= uStack_30) break;
      if (Element == (matroska_block *)0xffffffffffffff78) {
        __assert_fail("&(Element->SizeList)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x65b,"char GetBestLacingType(const matroska_block *, int)");
      }
      if (*(int *)((Element->SizeList)._Begin + uStack_30 * 4) != Elt._4_4_) break;
      uStack_30 = uStack_30 + 1;
    }
    if (Element == (matroska_block *)0xffffffffffffff78) {
      __assert_fail("&(Element->SizeList)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x65e,"char GetBestLacingType(const matroska_block *, int)");
    }
    if (uStack_30 == (Element->SizeList)._Used >> 2) {
      Element_local._7_1_ = '\x02';
    }
    else {
      if (Element->WriteTrack == (ebml_master *)0x0) {
        __assert_fail("Element->WriteTrack!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x662,"char GetBestLacingType(const matroska_block *, int)");
      }
      peVar3 = Element->WriteTrack;
      peVar2 = MATROSKA_getContextContentEncodings();
      peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
      if (peVar3 != (ebml_master *)0x0) {
        peVar2 = MATROSKA_getContextContentEncoding();
        peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
        if ((peVar3->Base).Base.Children != (nodetree *)0x0) {
          if (peVar3 == (ebml_master *)(peVar3->Base).Base.Next) {
            __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x669,"char GetBestLacingType(const matroska_block *, int)");
          }
          if ((peVar3->Base).Base.Next != (nodetree *)0x0) {
            return '\0';
          }
          peVar2 = MATROSKA_getContextContentEncodingScope();
          Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
          if (Element_00 != (ebml_integer *)0x0) {
            iVar4 = EBML_IntegerValue(Element_00);
            CanCompress._0_4_ = (MatroskaContentEncodingScope)iVar4;
          }
          peVar2 = MATROSKA_getContextContentCompression();
          peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
          if (peVar3 == (ebml_master *)0x0) {
            return '\0';
          }
          peVar2 = MATROSKA_getContextContentCompAlgo();
          _CompressionScope = (ebml_integer *)EBML_MasterFindFirstElt(peVar3,peVar2,1,1,ForProfile);
          if (_CompressionScope != (ebml_integer *)0x0) {
            iVar4 = EBML_IntegerValue(_CompressionScope);
            CanCompress._4_4_ = (MatroskaTrackEncodingCompAlgo)iVar4;
          }
          if (CanCompress._4_4_ != MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP &&
              CanCompress._4_4_ != MATROSKA_TRACK_ENCODING_COMP_ZLIB) {
            return '\0';
          }
          iVar4 = EBML_IntegerValue(_CompressionScope);
          if (iVar4 == 3) {
            peVar2 = MATROSKA_getContextContentCompSettings();
            _CompressionScope = (ebml_integer *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
          }
        }
      }
      local_20 = 0;
      uStack_30 = 0;
      while( true ) {
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x687,"char GetBestLacingType(const matroska_block *, int)");
        }
        if (((Element->SizeList)._Used >> 2) - 1 <= uStack_30) break;
        fVar5 = GetBlockFrameSize(Element,uStack_30,&_CompressionScope->Base,CanCompress._4_4_,
                                  (MatroskaContentEncodingScope)CanCompress);
        for (Elt._4_4_ = (int)fVar5; 0xfe < Elt._4_4_; Elt._4_4_ = Elt._4_4_ + -0xff) {
          local_20 = local_20 + 1;
        }
        local_20 = local_20 + 1;
        uStack_30 = uStack_30 + 1;
      }
      fVar5 = GetBlockFrameSize(Element,0,&_CompressionScope->Base,CanCompress._4_4_,
                                (MatroskaContentEncodingScope)CanCompress);
      bVar1 = EBML_CodedSizeLength(fVar5,'\0',1);
      i._4_4_ = (uint)bVar1;
      uStack_30 = 1;
      while( true ) {
        if (Element == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Element->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x693,"char GetBestLacingType(const matroska_block *, int)");
        }
        if (((Element->SizeList)._Used >> 2) - 1 <= uStack_30) break;
        fVar5 = GetBlockFrameSize(Element,uStack_30,&_CompressionScope->Base,CanCompress._4_4_,
                                  (MatroskaContentEncodingScope)CanCompress);
        Elt._4_4_ = (int)fVar5 - Elt._4_4_;
        bVar1 = EBML_CodedSizeLengthSigned((long)Elt._4_4_,'\0');
        i._4_4_ = bVar1 + i._4_4_;
        uStack_30 = uStack_30 + 1;
      }
      if (local_20 < (int)i._4_4_) {
        Element_local._7_1_ = '\x01';
      }
      else {
        Element_local._7_1_ = '\x03';
      }
    }
  }
  return Element_local._7_1_;
}

Assistant:

static char GetBestLacingType(const matroska_block *Element, int ForProfile)
{
    int XiphLacingSize, EbmlLacingSize;
    size_t i;
    int32_t DataSize;
    ebml_element *Elt, *Elt2, *Header = NULL;
    MatroskaTrackEncodingCompAlgo CompressionAlgo = MATROSKA_TRACK_ENCODING_COMP_NONE;
    MatroskaContentEncodingScope CompressionScope = MATROSKA_CONTENTENCODINGSCOPE_BLOCK;

    if (ARRAYCOUNT(Element->SizeList,int32_t) <= 1)
        return LACING_NONE;

    DataSize = ARRAYBEGIN(Element->SizeList,int32_t)[0];
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t);++i)
    {
        if (ARRAYBEGIN(Element->SizeList,int32_t)[i]!=DataSize)
            break;
    }
    if (i==ARRAYCOUNT(Element->SizeList,int32_t))
        return LACING_FIXED;

    // find out if compressed headers are used
    assert(Element->WriteTrack!=NULL);
    Elt = EBML_MasterFindChild(Element->WriteTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return 0; // TODO support cascaded compression/encryption

            Elt2 = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentEncodingScope());
            if (Elt2)
                CompressionScope = EBML_IntegerValue((ebml_integer*)Elt2);

            Elt = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return 0; // TODO: support encryption

            Header = EBML_MasterGetChild((ebml_master*)Elt, MATROSKA_getContextContentCompAlgo(),ForProfile);
            if (Header)
                CompressionAlgo = EBML_IntegerValue((ebml_integer*)Header);
            bool_t CanCompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanCompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanCompress = 1;
#endif
            if (!CanCompress)
                return 0;

            if (EBML_IntegerValue((ebml_integer*)Header)==MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                Header = EBML_MasterFindChild((ebml_master*)Elt, MATROSKA_getContextContentCompSettings());
        }
    }

    XiphLacingSize = 0;
    for (i=0;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope);
        while (DataSize >= 0xFF)
        {
            XiphLacingSize++;
            DataSize -= 0xFF;
        }
        XiphLacingSize++;
    }

    EbmlLacingSize = EBML_CodedSizeLength(GetBlockFrameSize(Element, 0, Header, CompressionAlgo, CompressionScope),0,1);
    for (i=1;i<ARRAYCOUNT(Element->SizeList,int32_t)-1;++i)
    {
        DataSize = (int32_t)GetBlockFrameSize(Element, i, Header, CompressionAlgo, CompressionScope) - DataSize;
        EbmlLacingSize += EBML_CodedSizeLengthSigned(DataSize,0);
    }

    if (XiphLacingSize < EbmlLacingSize)
        return LACING_XIPH;
    else
        return LACING_EBML;
}